

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

double __thiscall Quat4f::exp(Quat4f *this,double __x)

{
  undefined8 uVar1;
  long in_RSI;
  float fVar2;
  double __x_00;
  double dVar3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(*(float *)(in_RSI + 8) * *(float *)(in_RSI + 8))),
                           ZEXT416(*(uint *)(in_RSI + 4)),ZEXT416(*(uint *)(in_RSI + 4)));
  auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + 0xc)),ZEXT416(*(uint *)(in_RSI + 0xc)),auVar4)
  ;
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  __x_00 = (double)auVar4._0_4_;
  if (1e-06 <= __x_00) {
    dVar3 = sin(__x_00);
    fVar2 = (float)(dVar3 / __x_00);
    auVar7._0_8_ = cos(__x_00);
    auVar7._8_56_ = extraout_var_00;
    auVar4 = auVar7._0_16_;
    auVar8._0_4_ = (float)*(undefined8 *)(in_RSI + 4) * fVar2;
    auVar8._4_4_ = (float)((ulong)*(undefined8 *)(in_RSI + 4) >> 0x20) * fVar2;
    auVar8._8_4_ = fVar2 * 0.0;
    auVar8._12_4_ = fVar2 * 0.0;
    fVar2 = fVar2 * *(float *)(in_RSI + 0xc);
  }
  else {
    auVar6._0_8_ = cos(__x_00);
    auVar6._8_56_ = extraout_var;
    auVar4 = auVar6._0_16_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(in_RSI + 4);
    fVar2 = *(float *)(in_RSI + 0xc);
  }
  auVar5._0_4_ = (float)auVar4._0_8_;
  auVar5._4_12_ = auVar4._4_12_;
  this->m_elements[0] = auVar5._0_4_;
  uVar1 = vmovlps_avx(auVar8);
  *(undefined8 *)(this->m_elements + 1) = uVar1;
  this->m_elements[3] = fVar2;
  return auVar5._0_8_;
}

Assistant:

Quat4f Quat4f::exp() const
{
	float theta =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( theta < 1e-6 )
	{
		return Quat4f( cos( theta ), m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = sin( theta ) / theta;
		return Quat4f( cos( theta ), m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );		
	}
}